

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<float>(size_t *ix_arr,float *x,size_t st,size_t end,MissingAction missing_action,
                     double *xmin,double *xmax,bool *unsplittable)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  size_t row;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar4;
  double __x;
  undefined1 local_68 [16];
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  if (missing_action == Fail) {
    __x = -INFINITY;
    local_68._0_8_ = INFINITY;
    for (; st <= end; st = st + 1) {
      dVar2 = (double)x[ix_arr[st]];
      dVar4 = dVar2;
      if ((double)local_68._0_8_ <= dVar2) {
        dVar4 = (double)local_68._0_8_;
      }
      *xmin = dVar4;
      if (dVar2 <= __x) {
        dVar2 = __x;
      }
      __x = dVar2;
      *xmax = __x;
      local_68._0_8_ = dVar4;
    }
  }
  else {
    local_68 = ZEXT816(0x7ff0000000000000);
    __x = -INFINITY;
    for (; st <= end; st = st + 1) {
      fVar1 = x[ix_arr[st]];
      dVar2 = fmin((double)local_68._0_8_,(double)fVar1);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar2;
      local_68._12_4_ = extraout_XMM0_Dd;
      *xmin = dVar2;
      __x = fmax(__x,(double)fVar1);
      *xmax = __x;
    }
  }
  bVar3 = true;
  if ((((double)local_68._0_8_ != __x) || (NAN((double)local_68._0_8_) || NAN(__x))) &&
     ((double)local_68._0_8_ != INFINITY || __x != -INFINITY)) {
    bVar3 = NAN(__x);
  }
  *unsplittable = bVar3;
  return;
}

Assistant:

void get_range(size_t ix_arr[], real_t *restrict x, size_t st, size_t end,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;
    double xval;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = (xval < xmin)? xval : xmin;
            xmax = (xval > xmax)? xval : xmax;
        }
    }


    else
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = std::fmin(xmin, xval);
            xmax = std::fmax(xmax, xval);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}